

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi64 jx9TokenValueToInt64(SyString *pVal)

{
  sxu32 nLen;
  char *zSrc;
  char **in_RCX;
  sxi64 iVal;
  sxi64 local_8;
  
  local_8 = 0;
  nLen = pVal->nByte;
  if (nLen != 0) {
    zSrc = pVal->zString;
    if (*zSrc != '0') {
      SyStrToInt64(zSrc,nLen,&local_8,in_RCX);
      return local_8;
    }
    if (nLen != 1) {
      if ((zSrc[1] & 0xdfU) == 0x42) {
        SyBinaryStrToInt64(zSrc,nLen,&local_8,in_RCX);
        return local_8;
      }
      if ((zSrc[1] & 0xdfU) == 0x58) {
        SyHexStrToInt64(zSrc,nLen,&local_8,in_RCX);
        return local_8;
      }
      SyOctalStrToInt64(zSrc,nLen,&local_8,in_RCX);
      return local_8;
    }
  }
  return 0;
}

Assistant:

JX9_PRIVATE sxi64 jx9TokenValueToInt64(SyString *pVal)
{
	sxi64 iVal = 0;
	if( pVal->nByte <= 0 ){
		return 0;
	}
	if( pVal->zString[0] == '0' ){
		sxi32 c;
		if( pVal->nByte == sizeof(char) ){
			return 0;
		}
		c = pVal->zString[1];
		if( c  == 'x' || c == 'X' ){
			/* Hex digit stream */
			SyHexStrToInt64(pVal->zString, pVal->nByte, (void *)&iVal, 0);
		}else if( c == 'b' || c == 'B' ){
			/* Binary digit stream */
			SyBinaryStrToInt64(pVal->zString, pVal->nByte, (void *)&iVal, 0);
		}else{
			/* Octal digit stream */
			SyOctalStrToInt64(pVal->zString, pVal->nByte, (void *)&iVal, 0);
		}
	}else{
		/* Decimal digit stream */
		SyStrToInt64(pVal->zString, pVal->nByte, (void *)&iVal, 0);
	}
	return iVal;
}